

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O1

join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char>_>_>_>_>_>
* __thiscall
burst::
make_join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>>>>
          (join_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char>_>_>_>_>_>
           *__return_storage_ptr__,burst *this,
          owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *first,owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *last)

{
  outer_range_iterator local_38;
  outer_range_iterator local_20;
  
  local_20.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)this;
  local_20.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)this = 0;
  local_20.m_iterator._M_current =
       *(iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         **)(this + 0x10);
  local_38.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (first->m_container).
            super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_38.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (first->m_container).
       super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (first->m_container).
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (first->m_container).
  super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_38.m_iterator._M_current = (first->m_iterator)._M_current;
  detail::
  join_iterator_impl<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  ::join_iterator_impl(__return_storage_ptr__,&local_20,&local_38);
  if (local_38.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_join_iterator (Iterator first, Iterator last)
    {
        return join_iterator<Iterator>(std::move(first), std::move(last));
    }